

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTestFixture.cpp
# Opt level: O0

void __thiscall
celero::ThreadTestFixture::startThreads
          (ThreadTestFixture *this,uint64_t threads,uint64_t iterations)

{
  Impl *this_00;
  system_error *e;
  value_type local_50 [2];
  ulong local_30;
  uint64_t i;
  uint64_t iterationsPerThread;
  uint64_t iterations_local;
  uint64_t threads_local;
  ThreadTestFixture *this_local;
  
  i = iterations / threads;
  iterationsPerThread = iterations;
  iterations_local = threads;
  threads_local = (uint64_t)this;
  for (local_30 = 0; local_30 < iterations_local; local_30 = local_30 + 1) {
    this_00 = Pimpl<celero::ThreadTestFixture::Impl>::operator->(&this->pimpl);
    std::async<celero::ThreadTestFixture::startThreads(unsigned_long,unsigned_long)::__0>
              ((launch)local_50,(type *)0x1);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::push_back
              (&this_00->futures,local_50);
    std::future<void>::~future(local_50);
  }
  return;
}

Assistant:

void ThreadTestFixture::startThreads(uint64_t threads, uint64_t iterations)
{
	const uint64_t iterationsPerThread = iterations / threads;

	for(uint64_t i = 0; i < threads; ++i)
	{
		try
		{
			this->pimpl->futures.push_back(
				// std::async(std::launch::deferred,
				std::async(std::launch::async, [this, i, iterationsPerThread]() {
					this->pimpl->currentThreadId = i + 1;
					for(auto threadIterationCounter = size_t(0); threadIterationCounter < iterationsPerThread;)
					{
						this->pimpl->currentCallId = ++threadIterationCounter;
						this->UserBenchmark();
					}
				}));
		}
		catch(std::system_error& e)
		{
			std::cerr << "ERROR: Exception. Error Code: " << e.code() << ", " << e.what() << std::endl;
		}
	}
}